

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O3

Wln_Ntk_t * Wln_NtkFromNdr(void *pData)

{
  Vec_Int_t *pVVar1;
  Wln_Vec_t *pWVar2;
  Hash_IntMan_t *pHVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  undefined8 *puVar7;
  void *pvVar8;
  Wln_Ntk_t *pWVar9;
  uchar *puVar10;
  int *piVar11;
  uint *puVar12;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar13;
  ulong uVar14;
  Abc_Nam_t *pAVar15;
  int iVar16;
  long lVar17;
  byte bVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint *puVar22;
  int Ent_1;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint *puVar27;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar28;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar29;
  int Ent;
  Wln_Ntk_t *pWVar30;
  long lVar31;
  Ndr_Data_t *p;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar32;
  int Ent_4;
  uint uVar33;
  bool bVar35;
  int fFound;
  int End;
  int local_c4;
  Wln_Ntk_t *local_c0;
  Ndr_Data_t *local_b8;
  uint local_ac;
  undefined8 *local_a8;
  uint local_a0;
  uint local_9c;
  ulong local_98;
  Hash_IntMan_t *local_90;
  int local_84;
  uint local_80;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  Vec_Int_t *local_68;
  int local_5c;
  int local_58 [8];
  long local_38;
  ulong uVar34;
  
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 100;
  pvVar8 = malloc(800);
  puVar7[1] = pvVar8;
  iVar16 = *(int *)(*(long *)((long)pData + 0x10) + 8) + 2;
  iVar23 = 0;
  local_b8 = (Ndr_Data_t *)pData;
  if (3 < iVar16) {
    iVar24 = 3;
    iVar23 = 0;
    do {
      bVar18 = *(byte *)(*(long *)((long)pData + 8) + (long)iVar24);
      if (bVar18 == 0) goto LAB_00360b02;
      iVar25 = 1;
      if (bVar18 < 4) {
        iVar25 = *(int *)(*(long *)((long)pData + 0x10) + (long)iVar24 * 4);
      }
      iVar23 = iVar23 + (uint)(bVar18 == 3);
      iVar24 = iVar24 + iVar25;
    } while (iVar24 < iVar16);
  }
  pWVar9 = Wln_NtkAlloc("top",iVar23);
  Wln_NtkCheckIntegrity(local_b8);
  uVar20 = (pWVar9->vTypes).nCap;
  if ((pWVar9->vNameIds).nCap < (int)uVar20) {
    piVar6 = (pWVar9->vNameIds).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar20 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar20 << 2);
    }
    (pWVar9->vNameIds).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0036080b;
    (pWVar9->vNameIds).nCap = uVar20;
  }
  if (0 < (int)uVar20) {
    memset((pWVar9->vNameIds).pArray,0,(ulong)uVar20 * 4);
  }
  (pWVar9->vNameIds).nSize = uVar20;
  uVar20 = (pWVar9->vTypes).nCap;
  local_68 = pVVar5;
  if ((pWVar9->vInstIds).nCap < (int)uVar20) {
    piVar6 = (pWVar9->vInstIds).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar20 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar20 << 2);
    }
    (pWVar9->vInstIds).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0036080b;
    (pWVar9->vInstIds).nCap = uVar20;
  }
  local_a8 = puVar7;
  if (0 < (int)uVar20) {
    memset((pWVar9->vInstIds).pArray,0,(ulong)uVar20 * 4);
  }
  p = local_b8;
  (pWVar9->vInstIds).nSize = uVar20;
  puVar12 = local_b8->pBody;
  local_c0 = pWVar9;
  if (3 < (int)(puVar12[2] + 2)) {
    puVar10 = local_b8->pHead;
    iVar16 = 3;
    do {
      bVar18 = puVar10[iVar16];
      if (bVar18 == 3) {
        iVar23 = iVar16 + 1;
        for (iVar24 = iVar23; iVar24 < (int)(puVar12[iVar16] + iVar16); iVar24 = iVar24 + uVar20) {
          bVar18 = puVar10[iVar24];
          if (bVar18 == 6) {
            if (puVar12[iVar24] != 3) goto LAB_0035fd71;
            break;
          }
          if (bVar18 == 0) goto LAB_00360b02;
          uVar20 = 1;
          if (bVar18 < 4) {
            uVar20 = puVar12[iVar24];
          }
        }
        iVar24 = Ndr_ObjGetRange(p,iVar16,local_58,&local_c4);
        uVar33 = Wln_ObjAlloc(local_c0,3,iVar24,local_58[0],local_c4);
        puVar12 = p->pBody;
        iVar24 = puVar12[iVar16] + iVar16;
        uVar20 = 0xffffffff;
        if (iVar23 < iVar24) {
          iVar25 = iVar23;
          do {
            bVar18 = p->pHead[iVar25];
            if (bVar18 == 5) {
              uVar21 = puVar12[iVar25];
              goto LAB_0035fce3;
            }
            if (bVar18 == 0) goto LAB_00360b02;
            uVar21 = 1;
            if (bVar18 < 4) {
              uVar21 = puVar12[iVar25];
            }
            iVar25 = iVar25 + uVar21;
          } while (iVar25 < iVar24);
          uVar21 = 0xffffffff;
LAB_0035fce3:
          do {
            bVar18 = p->pHead[iVar23];
            if (bVar18 == 7) {
              uVar20 = puVar12[iVar23];
              break;
            }
            if (bVar18 == 0) goto LAB_00360b02;
            uVar4 = 1;
            if (bVar18 < 4) {
              uVar4 = puVar12[iVar23];
            }
            iVar23 = iVar23 + uVar4;
          } while (iVar23 < iVar24);
        }
        else {
          uVar21 = 0xffffffff;
        }
        if (((int)uVar33 < 0) || ((local_c0->vNameIds).nSize <= (int)uVar33)) goto LAB_00360b40;
        (local_c0->vNameIds).pArray[uVar33] = uVar21;
        if (0 < (int)uVar20) {
          if ((local_c0->vInstIds).nSize <= (int)uVar33) goto LAB_00360b40;
          (local_c0->vInstIds).pArray[uVar33] = uVar20;
        }
        puVar10 = p->pHead;
        bVar18 = puVar10[iVar16];
      }
      else if (bVar18 == 0) goto LAB_00360b02;
      if (bVar18 == 0) goto LAB_00360b02;
      uVar20 = 1;
      if (bVar18 < 4) {
LAB_0035fd71:
        uVar20 = puVar12[iVar16];
      }
      iVar16 = iVar16 + uVar20;
    } while (iVar16 < (int)(puVar12[2] + 2));
    pWVar9 = local_c0;
    if (3 < (int)(puVar12[2] + 2)) {
      puVar10 = p->pHead;
      iVar16 = 3;
      local_70 = 0;
      local_78 = 100;
LAB_0035fdaf:
      lVar31 = (long)iVar16;
      bVar18 = puVar10[lVar31];
      if (bVar18 == 3) {
        iVar23 = iVar16 + 1;
        for (iVar24 = iVar23; iVar24 < (int)(puVar12[lVar31] + iVar16); iVar24 = iVar24 + uVar20) {
          bVar18 = puVar10[iVar24];
          if (bVar18 == 6) {
            iVar25 = iVar23;
            if (puVar12[iVar24] != 3) goto LAB_0035fe2f;
            break;
          }
          if (bVar18 == 0) goto LAB_00360b02;
          uVar20 = 1;
          if (bVar18 < 4) {
            uVar20 = puVar12[iVar24];
          }
        }
        goto LAB_0035fe65;
      }
      if (bVar18 != 0) goto LAB_0035fdc4;
      goto LAB_00360b02;
    }
  }
  goto LAB_00360741;
  while( true ) {
    if (bVar18 == 0) goto LAB_00360b02;
    uVar20 = 1;
    if (bVar18 < 4) {
      uVar20 = puVar12[iVar25];
    }
    iVar25 = iVar25 + uVar20;
    if ((int)(puVar12[lVar31] + iVar16) <= iVar25) break;
LAB_0035fe2f:
    bVar18 = puVar10[iVar25];
    if (bVar18 == 6) {
      if (puVar12[iVar25] != 4) {
        iVar24 = Ndr_ObjGetRange(p,iVar16,local_58,&local_c4);
        puVar12 = p->pBody;
        iVar25 = puVar12[lVar31] + iVar16;
        if (iVar23 < iVar25) {
          local_9c = 0xffffffff;
          iVar26 = iVar23;
          goto LAB_0035feb6;
        }
        puVar22 = (uint *)0x0;
        uVar20 = 0xffffffff;
        uVar33 = 0;
        goto LAB_0035ff61;
      }
      break;
    }
  }
LAB_0035fe65:
  puVar12 = p->pBody;
  goto LAB_0035fe69;
  while( true ) {
    if (bVar18 == 0) goto LAB_00360b02;
    uVar20 = 1;
    if (bVar18 < 4) {
      uVar20 = puVar12[iVar26];
    }
    iVar26 = iVar26 + uVar20;
    if (iVar25 <= iVar26) break;
LAB_0035feb6:
    bVar18 = p->pHead[iVar26];
    if (bVar18 == 6) {
      uVar20 = puVar12[iVar26];
      goto LAB_0035ff04;
    }
  }
  uVar20 = 0xffffffff;
LAB_0035ff04:
  puVar22 = (uint *)0x0;
  puVar27 = (uint *)0x0;
  uVar33 = 0;
  iVar26 = iVar23;
  do {
    bVar18 = p->pHead[iVar26];
    if (bVar18 == 4) {
      uVar33 = uVar33 + 1;
      uVar21 = 1;
      puVar27 = puVar22;
      if (puVar22 == (uint *)0x0) {
        puVar22 = puVar12 + iVar26;
        puVar27 = puVar22;
      }
    }
    else {
      if (bVar18 == 0) goto LAB_00360b02;
      if (puVar27 != (uint *)0x0) break;
      if (bVar18 < 4) {
        uVar21 = puVar12[iVar26];
      }
      else {
        uVar21 = 1;
      }
      puVar27 = (uint *)0x0;
    }
    iVar26 = iVar26 + uVar21;
  } while (iVar26 < iVar25);
LAB_0035ff61:
  local_9c = 0xffffffff;
  local_5c = local_58[0];
  local_84 = local_c4;
  local_7c = uVar20;
  local_ac = Wln_ObjAlloc(local_c0,uVar20,iVar24,local_58[0],local_c4);
  pVVar5 = local_68;
  puVar12 = p->pBody;
  iVar24 = puVar12[lVar31] + iVar16;
  local_38 = lVar31;
  if (iVar23 < iVar24) {
    iVar25 = iVar23;
    do {
      bVar18 = p->pHead[iVar25];
      iVar26 = iVar23;
      if (bVar18 == 5) {
        local_80 = puVar12[iVar25];
        goto LAB_0035fff5;
      }
      if (bVar18 == 0) goto LAB_00360b02;
      uVar20 = 1;
      if (bVar18 < 4) {
        uVar20 = puVar12[iVar25];
      }
      iVar25 = iVar25 + uVar20;
    } while (iVar25 < iVar24);
    local_80 = 0xffffffff;
LAB_0035fff5:
    do {
      bVar18 = p->pHead[iVar26];
      if (bVar18 == 7) {
        local_9c = puVar12[iVar26];
        break;
      }
      if (bVar18 == 0) goto LAB_00360b02;
      uVar20 = 1;
      if (bVar18 < 4) {
        uVar20 = puVar12[iVar26];
      }
      iVar26 = iVar26 + uVar20;
    } while (iVar26 < iVar24);
  }
  else {
    local_80 = 0xffffffff;
  }
  local_68->nSize = 0;
  if (0 < (int)uVar33) {
    uVar19 = 0;
    do {
      Vec_IntPush(pVVar5,puVar22[uVar19]);
      uVar19 = uVar19 + 1;
    } while (uVar33 != uVar19);
  }
  lVar31 = local_38;
  pWVar9 = local_c0;
  if (local_7c == 0x58) {
    __assert_fail("Type != ABC_OPER_DFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                  ,0xd6,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
  }
  if (((int)local_ac < 0) || ((local_c0->vTypes).nSize <= (int)local_ac)) {
LAB_00360b21:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar19 = (ulong)local_ac;
  iVar24 = (local_c0->vTypes).pArray[uVar19];
  local_98 = uVar19;
  if (iVar24 == 0x61) {
    puVar12 = local_b8->pBody;
    iVar24 = puVar12[local_38] + (int)local_38;
    if (iVar23 < iVar24) {
      do {
        bVar18 = local_b8->pHead[iVar23];
        if (bVar18 == 9) {
          puVar12 = puVar12 + iVar23;
          goto LAB_0036019e;
        }
        if (bVar18 == 0) goto LAB_00360b02;
        uVar20 = 1;
        if (bVar18 < 4) {
          uVar20 = puVar12[iVar23];
        }
        iVar23 = iVar23 + uVar20;
      } while (iVar23 < iVar24);
    }
    puVar12 = (uint *)0x0;
LAB_0036019e:
    iVar23 = (int)local_78;
    if ((int)local_70 == iVar23) {
      if (iVar23 < 0x10) {
        if ((void *)local_a8[1] == (void *)0x0) {
          pvVar8 = malloc(0x80);
        }
        else {
          pvVar8 = realloc((void *)local_a8[1],0x80);
        }
        local_a8[1] = pvVar8;
        *(undefined4 *)local_a8 = 0x10;
        local_78 = 0x10;
      }
      else {
        local_78 = (ulong)(uint)(iVar23 * 2);
        if ((void *)local_a8[1] == (void *)0x0) {
          pvVar8 = malloc(local_78 * 8);
        }
        else {
          pvVar8 = realloc((void *)local_a8[1],local_78 * 8);
        }
        local_a8[1] = pvVar8;
        *(int *)local_a8 = (int)local_78;
      }
    }
    else {
      pvVar8 = (void *)local_a8[1];
    }
    *(uint *)((long)local_a8 + 4) = (int)local_70 + 1U;
    *(uint **)((long)pvVar8 + (long)(int)local_70 * 8) = puVar12;
    local_70 = (ulong)((int)local_70 + 1U);
    p = local_b8;
    uVar20 = local_ac;
  }
  else {
    p = local_b8;
    uVar20 = local_ac;
    if (iVar24 == 0x5b) {
      local_90 = local_c0->pRanges;
      iVar23 = local_90->vObjs->nSize;
      iVar24 = iVar23 + 3;
      if (-1 < iVar23) {
        iVar24 = iVar23;
      }
      pVVar5 = local_90->vTable;
      local_a0 = iVar24 >> 2;
      if (pVVar5->nSize < (int)local_a0) {
        uVar19 = (ulong)(pVVar5->nSize * 2 - 1);
        while( true ) {
          do {
            uVar20 = (uint)uVar19;
            uVar33 = uVar20 + 1;
            uVar34 = (ulong)uVar33;
            uVar14 = uVar19 & 1;
            uVar19 = uVar34;
          } while (uVar14 != 0);
          if (uVar33 < 9) break;
          iVar24 = 5;
          while (uVar33 % (iVar24 - 2U) != 0) {
            uVar21 = iVar24 * iVar24;
            iVar24 = iVar24 + 2;
            if (uVar33 < uVar21) goto LAB_00360122;
          }
        }
LAB_00360122:
        if (pVVar5->nCap < (int)uVar33) {
          if (pVVar5->pArray == (int *)0x0) {
            piVar6 = (int *)malloc((long)(int)uVar33 << 2);
          }
          else {
            piVar6 = (int *)realloc(pVVar5->pArray,(long)(int)uVar33 << 2);
          }
          pVVar5->pArray = piVar6;
          if (piVar6 == (int *)0x0) goto LAB_0036080b;
          pVVar5->nCap = uVar33;
        }
        if (uVar20 < 0x7fffffff) {
          memset(pVVar5->pArray,0,uVar34 << 2);
        }
        pVVar5->nSize = uVar33;
        if (iVar23 < 8) {
          pVVar5 = local_90->vTable;
        }
        else {
          pVVar1 = local_90->vObjs;
          uVar19 = 2;
          if (2 < (int)local_a0) {
            uVar19 = (ulong)local_a0;
          }
          uVar14 = 1;
          do {
            uVar20 = pVVar1->nSize;
            if ((long)(int)uVar20 <= (long)(uVar14 * 4)) goto LAB_00360b7e;
            piVar6 = pVVar1->pArray;
            piVar6[uVar14 * 4 + 3] = 0;
            pVVar5 = local_90->vTable;
            uVar34 = (ulong)(uint)(piVar6[uVar14 * 4 + 1] * 0x1ec1 + piVar6[uVar14 * 4] * 0x1051) %
                     (ulong)(uint)pVVar5->nSize;
            if (((int)uVar34 < 0) || (pVVar5->nSize <= (int)uVar34)) goto LAB_00360b7e;
            iVar23 = pVVar5->pArray[uVar34];
            if (iVar23 == 0) {
              piVar11 = pVVar5->pArray + uVar34;
            }
            else {
              do {
                if ((iVar23 < 0) ||
                   (uVar33 = iVar23 * 4,
                   uVar20 == uVar33 || SBORROW4(uVar20,uVar33) != (int)(uVar20 + iVar23 * -4) < 0))
                goto LAB_00360b7e;
                piVar11 = piVar6 + uVar33;
                if ((*piVar11 == piVar6[uVar14 * 4]) && (piVar11[1] == piVar6[uVar14 * 4 + 1])) {
                  __assert_fail("*pPlace == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                                ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
                }
                iVar23 = piVar11[3];
              } while (iVar23 != 0);
              piVar11 = piVar11 + 3;
            }
            *piVar11 = (int)uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar19);
        }
      }
      uVar19 = local_98;
      p = local_b8;
      pWVar9 = local_c0;
      uVar14 = (ulong)(uint)(local_84 * 0x1ec1 + local_5c * 0x1051) % (ulong)(uint)pVVar5->nSize;
      if (((int)uVar14 < 0) || (pVVar5->nSize <= (int)uVar14)) {
LAB_00360b7e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar33 = pVVar5->pArray[uVar14];
      pVVar1 = local_90->vObjs;
      if (uVar33 == 0) {
        puVar12 = (uint *)(pVVar5->pArray + uVar14);
      }
      else {
        do {
          if ((int)uVar33 < 0) goto LAB_00360b7e;
          uVar20 = uVar33 * 4;
          uVar21 = pVVar1->nSize;
          if (uVar21 == uVar20 || SBORROW4(uVar21,uVar20) != (int)(uVar21 + uVar33 * -4) < 0)
          goto LAB_00360b7e;
          piVar6 = pVVar1->pArray + uVar20;
          if ((*piVar6 == local_5c) && (piVar6[1] == local_84)) goto LAB_00360410;
          uVar33 = piVar6[3];
        } while (uVar33 != 0);
        puVar12 = (uint *)(piVar6 + 3);
      }
      *puVar12 = local_a0;
      Vec_IntPush(pVVar1,local_5c);
      pHVar3 = local_90;
      Vec_IntPush(local_90->vObjs,local_84);
      Vec_IntPush(pHVar3->vObjs,0);
      Vec_IntPush(pHVar3->vObjs,0);
      uVar33 = local_a0;
LAB_00360410:
      uVar20 = local_ac;
      Wln_ObjSetSlice(pWVar9,local_ac,uVar33);
    }
  }
  Wln_ObjAddFanins(pWVar9,uVar20,local_68);
  if ((pWVar9->vNameIds).nSize <= (int)local_ac) goto LAB_00360b40;
  (pWVar9->vNameIds).pArray[uVar19] = local_80;
  if (0 < (int)local_9c) {
    if ((pWVar9->vInstIds).nSize <= (int)local_ac) goto LAB_00360b40;
    (pWVar9->vInstIds).pArray[uVar19] = local_9c;
  }
  if (local_7c == 0x35) {
    if (pWVar9->vFanins[uVar19].nSize != 2) {
      __assert_fail("Wln_ObjFaninNum(pNtk, iObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                    ,0xe2,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
    }
    Wln_ObjSetSigned(pWVar9,pWVar9->vFanins[uVar19].field_2.Array[0]);
    paVar13 = &pWVar9->vFanins[uVar19].field_2;
    if (2 < pWVar9->vFanins[uVar19].nSize) {
      paVar13 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar13->pArray[0];
    }
    Wln_ObjSetSigned(pWVar9,paVar13->Array[1]);
  }
  puVar10 = p->pHead;
  bVar18 = puVar10[lVar31];
LAB_0035fdc4:
  if (bVar18 == 0) goto LAB_00360b02;
  puVar12 = p->pBody;
  uVar20 = 1;
  if (3 < bVar18) goto LAB_0035fe6d;
LAB_0035fe69:
  uVar20 = puVar12[lVar31];
LAB_0035fe6d:
  iVar16 = iVar16 + uVar20;
  if ((int)(puVar12[2] + 2) <= iVar16) goto LAB_00360524;
  goto LAB_0035fdaf;
LAB_00360524:
  if (3 < (int)(puVar12[2] + 2)) {
    puVar10 = p->pHead;
    iVar16 = 3;
    do {
      bVar18 = puVar10[iVar16];
      if (bVar18 == 3) {
        iVar23 = iVar16 + 1;
        for (iVar24 = iVar23; iVar24 < (int)(puVar12[iVar16] + iVar16); iVar24 = iVar24 + uVar20) {
          bVar18 = puVar10[iVar24];
          if (bVar18 == 6) {
            if (puVar12[iVar24] != 4) {
              puVar12 = p->pBody;
              goto LAB_00360725;
            }
            break;
          }
          if (bVar18 == 0) goto LAB_00360b02;
          uVar20 = 1;
          if (bVar18 < 4) {
            uVar20 = puVar12[iVar24];
          }
        }
        iVar24 = Ndr_ObjGetRange(p,iVar16,local_58,&local_c4);
        puVar12 = p->pBody;
        uVar20 = 0;
        if (iVar23 < (int)(puVar12[iVar16] + iVar16)) {
          puVar22 = (uint *)0x0;
          puVar27 = (uint *)0x0;
          iVar25 = iVar23;
          do {
            bVar18 = p->pHead[iVar25];
            if (bVar18 == 4) {
              uVar20 = uVar20 + 1;
              uVar33 = 1;
              puVar27 = puVar22;
              if (puVar22 == (uint *)0x0) {
                puVar27 = puVar12 + iVar25;
                puVar22 = puVar27;
              }
            }
            else {
              if (bVar18 == 0) goto LAB_00360b02;
              if (puVar27 != (uint *)0x0) break;
              if (bVar18 < 4) {
                uVar33 = puVar12[iVar25];
              }
              else {
                uVar33 = 1;
              }
              puVar27 = (uint *)0x0;
            }
            iVar25 = iVar25 + uVar33;
          } while (iVar25 < (int)(puVar12[iVar16] + iVar16));
          uVar20 = (uint)(uVar20 == 1);
        }
        else {
          puVar22 = (uint *)0x0;
        }
        iVar24 = Wln_ObjAlloc(local_c0,4,iVar24,local_58[0],local_c4);
        pWVar9 = local_c0;
        puVar12 = p->pBody;
        iVar25 = puVar12[iVar16] + iVar16;
        bVar35 = true;
        uVar33 = 0xffffffff;
        if (iVar23 < iVar25) {
          iVar26 = iVar23;
          do {
            bVar18 = p->pHead[iVar26];
            if (bVar18 == 5) {
              uVar33 = puVar12[iVar26];
              goto LAB_0036069f;
            }
            if (bVar18 == 0) goto LAB_00360b02;
            uVar33 = 1;
            if (bVar18 < 4) {
              uVar33 = puVar12[iVar26];
            }
            iVar26 = iVar26 + uVar33;
          } while (iVar26 < iVar25);
          uVar33 = 0xffffffff;
LAB_0036069f:
          do {
            bVar18 = p->pHead[iVar23];
            if (bVar18 == 7) {
              bVar35 = puVar12[iVar23] == 0xffffffff;
              break;
            }
            if (bVar18 == 0) goto LAB_00360b02;
            uVar21 = 1;
            if (bVar18 < 4) {
              uVar21 = puVar12[iVar23];
            }
            iVar23 = iVar23 + uVar21;
          } while (iVar23 < iVar25);
        }
        if ((((byte)uVar20 & uVar33 == 0xffffffff) != 1) || (!bVar35)) {
          __assert_fail("nArray == 1 && NameId == -1 && InstId == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                        ,0xef,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
        }
        Wln_ObjAddFanin(local_c0,iVar24,*puVar22);
        puVar10 = p->pHead;
        bVar18 = puVar10[iVar16];
      }
      else if (bVar18 == 0) {
LAB_00360b02:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      if (bVar18 == 0) goto LAB_00360b02;
      puVar12 = p->pBody;
      uVar20 = 1;
      if (bVar18 < 4) {
LAB_00360725:
        uVar20 = puVar12[iVar16];
      }
      iVar16 = iVar16 + uVar20;
    } while (iVar16 < (int)(puVar12[2] + 2));
  }
LAB_00360741:
  pVVar5 = local_68;
  if (local_68->pArray != (int *)0x0) {
    free(local_68->pArray);
  }
  free(pVVar5);
  puVar7 = local_a8;
  lVar31 = (long)(pWVar9->vInstIds).nSize;
  piVar6 = (pWVar9->vInstIds).pArray;
  if (lVar31 < 1) {
    if (piVar6 != (int *)0x0) goto LAB_00360799;
LAB_003607aa:
    (pWVar9->vInstIds).nCap = 0;
    (pWVar9->vInstIds).nSize = 0;
  }
  else {
    lVar17 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + (uint)(0 < piVar6[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar31 != lVar17);
    if (iVar16 == 0) {
LAB_00360799:
      free(piVar6);
      (pWVar9->vInstIds).pArray = (int *)0x0;
      goto LAB_003607aa;
    }
  }
  uVar20 = (pWVar9->vNameIds).nSize;
  uVar19 = (ulong)uVar20;
  if (uVar19 == 0) {
    pvVar8 = (void *)0x0;
    uVar33 = 0;
  }
  else {
    piVar6 = (pWVar9->vNameIds).pArray;
    iVar16 = *piVar6;
    if (1 < (int)uVar20) {
      uVar14 = 1;
      do {
        if (iVar16 <= piVar6[uVar14]) {
          iVar16 = piVar6[uVar14];
        }
        uVar14 = uVar14 + 1;
      } while (uVar19 != uVar14);
    }
    uVar33 = iVar16 + 1;
    if (iVar16 < 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = calloc(1,(ulong)uVar33 << 2);
      if (pvVar8 == (void *)0x0) {
LAB_0036080b:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    pWVar9 = local_c0;
    if (0 < (int)uVar20) {
      uVar14 = 0;
      do {
        uVar20 = piVar6[uVar14];
        if ((ulong)uVar20 != 0) {
          if (((int)uVar20 < 0) || (iVar16 < (int)uVar20)) {
LAB_00360b40:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)pvVar8 + (ulong)uVar20 * 4) = (int)uVar14;
        }
        uVar14 = uVar14 + 1;
      } while (uVar19 != uVar14);
    }
  }
  iVar16 = (pWVar9->vTypes).nSize;
  if (1 < iVar16) {
    pWVar2 = pWVar9->vFanins;
    paVar13 = &pWVar2[1].field_2;
    lVar31 = 1;
    do {
      iVar23 = pWVar2[lVar31].nSize;
      if (0 < iVar23) {
        paVar28 = &pWVar2[lVar31].field_2;
        lVar17 = 0;
        paVar29 = paVar13;
        do {
          paVar32 = paVar29;
          if (2 < iVar23) {
            paVar32 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)(paVar28->pArray[0] + lVar17);
          }
          uVar20 = paVar32->Array[0];
          if ((ulong)uVar20 != 0) {
            if (((int)uVar20 < 0) || ((int)uVar33 <= (int)uVar20)) goto LAB_00360b21;
            paVar32 = paVar28;
            if (2 < iVar23) {
              paVar32 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar28->pArray[0];
            }
            paVar32->Array[lVar17] = *(int *)((long)pvVar8 + (ulong)uVar20 * 4);
            iVar23 = pWVar2[lVar31].nSize;
          }
          lVar17 = lVar17 + 1;
          paVar29 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)((long)paVar29 + 4);
        } while (lVar17 < iVar23);
        iVar16 = (pWVar9->vTypes).nSize;
      }
      lVar31 = lVar31 + 1;
      paVar13 = paVar13 + 2;
    } while (lVar31 < iVar16);
  }
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
  }
  uVar20 = (pWVar9->vNameIds).nSize;
  pWVar30 = pWVar9;
  if ((ulong)uVar20 == 0) {
    uVar20 = 1;
  }
  else {
    puVar12 = (uint *)(pWVar9->vNameIds).pArray;
    uVar33 = *puVar12;
    if (1 < (int)uVar20) {
      uVar19 = 1;
      do {
        uVar21 = puVar12[uVar19];
        if ((int)uVar33 <= (int)uVar21) {
          uVar33 = uVar21;
        }
        uVar19 = uVar19 + 1;
      } while (uVar20 != uVar19);
    }
    uVar20 = uVar33 + 1;
    if (1 < uVar20) {
      uVar21 = 0;
      uVar19 = (ulong)uVar33;
      do {
        uVar4 = (uint)uVar19;
        uVar19 = uVar19 / 10;
        uVar21 = uVar21 + 1;
      } while (9 < uVar4);
      pAVar15 = Abc_NamStart(uVar20,10);
      pWVar9->pManName = pAVar15;
      puVar7 = local_a8;
      if (0 < (int)uVar33) {
        uVar20 = 1;
        do {
          sprintf((char *)local_58,"s%0*d",(ulong)uVar21,(ulong)uVar20);
          uVar4 = Abc_NamStrFindOrAdd(pWVar9->pManName,(char *)local_58,&local_c4);
          if ((local_c4 != 0) || (uVar20 != uVar4)) {
            __assert_fail("!fFound && i == NameId",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                          ,0x105,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
          }
          bVar35 = uVar20 != uVar33;
          pWVar30 = local_c0;
          puVar7 = local_a8;
          uVar20 = uVar20 + 1;
        } while (bVar35);
      }
      goto LAB_00360a2a;
    }
  }
  pAVar15 = Abc_NamStart(uVar20,10);
  pWVar9->pManName = pAVar15;
LAB_00360a2a:
  iVar16 = (pWVar30->vTypes).nSize;
  uVar20 = 0;
  if (1 < iVar16) {
    uVar20 = 0;
    lVar31 = 1;
    do {
      if ((pWVar30->vTypes).pArray[lVar31] == 0x61) {
        if (((int)uVar20 < 0) || (*(int *)((long)puVar7 + 4) <= (int)uVar20)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar19 = (ulong)uVar20;
        uVar20 = uVar20 + 1;
        iVar16 = Abc_NamStrFindOrAdd(pWVar9->pManName,*(char **)(puVar7[1] + uVar19 * 8),(int *)0x0)
        ;
        Wln_ObjSetConst(pWVar30,(int)lVar31,iVar16);
        iVar16 = (pWVar30->vTypes).nSize;
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < iVar16);
  }
  if (uVar20 == *(uint *)((long)puVar7 + 4)) {
    if ((void *)puVar7[1] != (void *)0x0) {
      free((void *)puVar7[1]);
    }
    free(puVar7);
    Wln_WriteVer(pWVar30,"temp_ndr.v");
    printf("Dumped design \"%s\" into file \"temp_ndr.v\".\n",pWVar30->pName);
    pWVar9 = Wln_NtkDupDfs(pWVar30);
    Wln_NtkFree(pWVar30);
    return pWVar9;
  }
  __assert_fail("i == Vec_PtrSize(vConstStrings)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNdr.c"
                ,0x10c,"Wln_Ntk_t *Wln_NtkFromNdr(void *)");
}

Assistant:

Wln_Ntk_t * Wln_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    Vec_Ptr_t * vConstStrings = Vec_PtrAlloc( 100 );
    int Mod = 2, i, k, iFanin, iObj, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Wln_Ntk_t * pTemp, * pNtk = Wln_NtkAlloc( "top", Ndr_DataObjNum(p, Mod) );
    Wln_NtkCheckIntegrity( pData );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wln_NtkCleanNameId( pNtk );
    Wln_NtkCleanInstId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int iObj = Wln_ObjAlloc( pNtk, ABC_OPER_CI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wln_ObjAlloc( pNtk, Type, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        assert( Type != ABC_OPER_DFF );
        if ( Wln_ObjIsSlice(pNtk, iObj) )
            Wln_ObjSetSlice( pNtk, iObj, Hash_Int2ManInsert(pNtk->pRanges, End, Beg, 0) );
        else if ( Wln_ObjIsConst(pNtk, iObj) )
            Vec_PtrPush( vConstStrings, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
//        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
//            ABC_SWAP( int, Wln_ObjFanins(pNtk, iObj)[1], Wln_ObjFanins(pNtk, iObj)[2] );
        Wln_ObjAddFanins( pNtk, iObj, vFanins );
        Wln_ObjSetNameId( pNtk, iObj, NameId );
        if ( InstId > 0 ) Wln_ObjSetInstId( pNtk, iObj, InstId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            assert( Wln_ObjFaninNum(pNtk, iObj) == 2 );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin0(pNtk, iObj) );
            Wln_ObjSetSigned( pNtk, Wln_ObjFanin1(pNtk, iObj) );
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjGetRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wln_ObjAlloc( pNtk, ABC_OPER_CO, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        int InstId  = Ndr_ObjReadBody( p, Obj, NDR_NAME );
        assert( nArray == 1 && NameId == -1 && InstId == -1 );
        Wln_ObjAddFanin( pNtk, iObj, pArray[0] );
    }
    Vec_IntFree( vFanins );
    // remove instance names if they are not given
    //Vec_IntPrint( &pNtk->vInstIds );
    if ( Vec_IntCountPositive(&pNtk->vInstIds) == 0 )
        Vec_IntErase( &pNtk->vInstIds );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wln_NtkForEachObj( pNtk, i )
        Wln_ObjForEachFanin( pNtk, i, iFanin, k )
            Wln_ObjSetFanin( pNtk, i, k, Vec_IntEntry(vName2Obj, iFanin) );
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    // add const strings
    i = 0;
    Wln_NtkForEachObj( pNtk, iObj )
        if ( Wln_ObjIsConst(pNtk, iObj) )
            Wln_ObjSetConst( pNtk, iObj, Abc_NamStrFindOrAdd(pNtk->pManName, (char *)Vec_PtrEntry(vConstStrings, i++), NULL) );
    assert( i == Vec_PtrSize(vConstStrings) );
    Vec_PtrFree( vConstStrings );
    //Ndr_NtkPrintObjects( pNtk );
    Wln_WriteVer( pNtk, "temp_ndr.v" );
    printf( "Dumped design \"%s\" into file \"temp_ndr.v\".\n", pNtk->pName );
    // derive topological order
    pNtk = Wln_NtkDupDfs( pTemp = pNtk );
    Wln_NtkFree( pTemp );
    //Ndr_NtkPrintObjects( pNtk );
    //pNtk->fMemPorts = 1;          // the network contains memory ports
    //pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}